

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::str_format_internal::anon_unknown_53::IntDigits::
PrintAsHexUpper<absl::lts_20250127::uint128>(IntDigits *this,uint128 v)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  char *local_28;
  char *p;
  IntDigits *this_local;
  uint128 v_local;
  
  v_local.lo_ = v.hi_;
  this_local = (IntDigits *)v.lo_;
  local_28 = &this->field_0x3c;
  do {
    uVar2 = uint128::operator_cast_to_unsigned_long((uint128 *)&this_local);
    pcVar3 = local_28 + -1;
    local_28[-1] = "0123456789ABCDEF"[uVar2 & 0xf];
    uint128::operator>>=((uint128 *)&this_local,4);
    bVar1 = uint128::operator_cast_to_bool((uint128 *)&this_local);
    local_28 = pcVar3;
  } while (bVar1);
  this->start_ = pcVar3;
  this->size_ = (long)this + (0x3c - (long)pcVar3);
  return;
}

Assistant:

void PrintAsHexUpper(T v) {
    static_assert(!IsSigned<T>::value, "");
    char *p = storage_ + sizeof(storage_);

    // kHexTable is only lowercase, so do it manually for uppercase.
    do {
      *--p = "0123456789ABCDEF"[static_cast<size_t>(v) & 15];
      v >>= 4;
    } while (v);
    start_ = p;
    size_ = static_cast<size_t>(storage_ + sizeof(storage_) - p);
  }